

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

int If_CutDsdLit(If_Man_t *p,If_Cut_t *pCut)

{
  int Lit;
  int *piVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = pCut->iCutFunc;
  if (-1 < iVar3) {
    piVar1 = p->vTtDsds[(byte)pCut->field_0x1f]->pArray;
    uVar2 = Abc_Lit2Var(iVar3);
    Lit = piVar1[uVar2];
    iVar3 = Abc_LitIsCompl(iVar3);
    iVar3 = Abc_LitNotCond(Lit,iVar3);
    return iVar3;
  }
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                ,0x1a6,"int If_CutTruthLit(If_Cut_t *)");
}

Assistant:

static inline int        If_CutDsdLit( If_Man_t * p, If_Cut_t * pCut )       { return Abc_Lit2LitL( Vec_IntArray(p->vTtDsds[pCut->nLeaves]), If_CutTruthLit(pCut) );               }